

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

IntrRecvError InterruptibleRecv(uint8_t *data,size_t len,milliseconds timeout,Sock *sock)

{
  long lVar1;
  strong_ordering sVar2;
  bool bVar3;
  long lVar4;
  int *piVar5;
  duration<long,_std::ratio<1L,_1000L>_> *pdVar6;
  ulong uVar7;
  long *in_RCX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int nErr;
  ssize_t ret;
  duration<long,_std::ratio<1L,_1000L>_> timeout_1;
  type remaining;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
  endTime;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
  curTime;
  CThreadInterrupt *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint in_stack_ffffffffffffff78;
  int iVar8;
  long local_68;
  long local_60;
  IntrRecvError local_54;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Now<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000l>>>>
            ();
  std::chrono::operator+
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
              *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff68);
  local_68 = in_RSI;
  local_60 = in_RDI;
  while( true ) {
    in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 & 0xffffff;
    if (local_68 != 0) {
      sVar2 = std::chrono::
              operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                        ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                          *)in_stack_ffffffffffffff68);
      std::__cmp_cat::__unspec::__unspec
                ((__unspec *)in_stack_ffffffffffffff68,(__unspec *)0x1988b18);
      bVar3 = std::operator<(sVar2._M_value);
      in_stack_ffffffffffffff78 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff78);
    }
    if ((char)(in_stack_ffffffffffffff78 >> 0x18) == '\0') {
      local_54 = (IntrRecvError)(local_68 != 0);
      goto LAB_01988c7f;
    }
    lVar4 = (**(code **)(*in_RCX + 0x20))(in_RCX,local_60,local_68);
    if (lVar4 < 1) {
      if (lVar4 == 0) {
        local_54 = Disconnected;
        goto LAB_01988c7f;
      }
      piVar5 = __errno_location();
      iVar8 = *piVar5;
      if (((iVar8 != 0x73) && (iVar8 != 0xb)) && (iVar8 != 0x16)) {
        local_54 = NetworkError;
        goto LAB_01988c7f;
      }
      std::chrono::operator-
                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                  *)in_stack_ffffffffffffff68);
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
                ((duration<long,_std::ratio<1L,_1000L>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff68);
      pdVar6 = std::min<std::chrono::duration<long,std::ratio<1l,1000l>>>
                         ((duration<long,_std::ratio<1L,_1000L>_> *)
                          CONCAT44(iVar8,in_stack_ffffffffffffff78),
                          (duration<long,_std::ratio<1L,_1000L>_> *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      uVar7 = (**(code **)(*in_RCX + 0x70))(in_RCX,pdVar6->__r,1);
      if ((uVar7 & 1) == 0) {
        local_54 = NetworkError;
        goto LAB_01988c7f;
      }
    }
    else {
      local_68 = local_68 - lVar4;
      local_60 = lVar4 + local_60;
    }
    bVar3 = CThreadInterrupt::operator_cast_to_bool(in_stack_ffffffffffffff68);
    if (bVar3) break;
    Now<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000l>>>>
              ();
  }
  local_54 = Interrupted;
LAB_01988c7f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_54;
  }
  __stack_chk_fail();
}

Assistant:

static IntrRecvError InterruptibleRecv(uint8_t* data, size_t len, std::chrono::milliseconds timeout, const Sock& sock)
{
    auto curTime{Now<SteadyMilliseconds>()};
    const auto endTime{curTime + timeout};
    while (len > 0 && curTime < endTime) {
        ssize_t ret = sock.Recv(data, len, 0); // Optimistically try the recv first
        if (ret > 0) {
            len -= ret;
            data += ret;
        } else if (ret == 0) { // Unexpected disconnection
            return IntrRecvError::Disconnected;
        } else { // Other error or blocking
            int nErr = WSAGetLastError();
            if (nErr == WSAEINPROGRESS || nErr == WSAEWOULDBLOCK || nErr == WSAEINVAL) {
                // Only wait at most MAX_WAIT_FOR_IO at a time, unless
                // we're approaching the end of the specified total timeout
                const auto remaining = std::chrono::milliseconds{endTime - curTime};
                const auto timeout = std::min(remaining, std::chrono::milliseconds{MAX_WAIT_FOR_IO});
                if (!sock.Wait(timeout, Sock::RECV)) {
                    return IntrRecvError::NetworkError;
                }
            } else {
                return IntrRecvError::NetworkError;
            }
        }
        if (g_socks5_interrupt) {
            return IntrRecvError::Interrupted;
        }
        curTime = Now<SteadyMilliseconds>();
    }
    return len == 0 ? IntrRecvError::OK : IntrRecvError::Timeout;
}